

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O2

bool draco::DecodeSymbols
               (uint32_t num_values,int num_components,DecoderBuffer *src_buffer,
               uint32_t *out_values)

{
  bool bVar1;
  undefined8 in_RAX;
  uint8_t scheme;
  uchar local_21;
  
  local_21 = (uchar)((ulong)in_RAX >> 0x38);
  if (num_values == 0) {
    return true;
  }
  bVar1 = DecoderBuffer::Decode<unsigned_char>(src_buffer,&local_21);
  if (bVar1) {
    if (local_21 == '\x01') {
      bVar1 = DecodeRawSymbols<draco::RAnsSymbolDecoder>(num_values,src_buffer,out_values);
      return bVar1;
    }
    if (local_21 == '\0') {
      bVar1 = DecodeTaggedSymbols<draco::RAnsSymbolDecoder>
                        (num_values,num_components,src_buffer,out_values);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool DecodeSymbols(uint32_t num_values, int num_components,
                   DecoderBuffer *src_buffer, uint32_t *out_values) {
  if (num_values == 0) {
    return true;
  }
  // Decode which scheme to use.
  uint8_t scheme;
  if (!src_buffer->Decode(&scheme)) {
    return false;
  }
  if (scheme == SYMBOL_CODING_TAGGED) {
    return DecodeTaggedSymbols<RAnsSymbolDecoder>(num_values, num_components,
                                                  src_buffer, out_values);
  } else if (scheme == SYMBOL_CODING_RAW) {
    return DecodeRawSymbols<RAnsSymbolDecoder>(num_values, src_buffer,
                                               out_values);
  }
  return false;
}